

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BuildSystemFrontend.cpp
# Opt level: O0

void __thiscall
llbuild::buildsystem::BuildSystemFrontend::~BuildSystemFrontend(BuildSystemFrontend *this)

{
  BuildSystemFrontendImpl *this_00;
  BuildSystemFrontend *this_local;
  
  this_00 = (BuildSystemFrontendImpl *)this->impl;
  if (this_00 != (BuildSystemFrontendImpl *)0x0) {
    anon_unknown.dwarf_141fe3::BuildSystemFrontendImpl::~BuildSystemFrontendImpl(this_00);
    operator_delete(this_00,0x58);
  }
  this->impl = (void *)0x0;
  return;
}

Assistant:

BuildSystemFrontend::~BuildSystemFrontend() {
  delete static_cast<BuildSystemFrontendImpl*>(impl);
  impl = nullptr;
}